

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FieldMap.cpp
# Opt level: O1

void __thiscall FIX::FieldMap::removeGroup(FieldMap *this,int tag)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  _Base_ptr p_Var6;
  _Base_ptr p_Var7;
  iterator __position;
  
  p_Var1 = &(this->m_groups)._M_t._M_impl.super__Rb_tree_header;
  p_Var2 = (this->m_groups)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var1->_M_header;
  for (; p_Var2 != (_Base_ptr)0x0; p_Var2 = (&p_Var2->_M_left)[(int)p_Var2[1]._M_color < tag]) {
    if (tag <= (int)p_Var2[1]._M_color) {
      p_Var6 = p_Var2;
    }
  }
  __position._M_node = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var1) &&
     (__position._M_node = p_Var6, tag < (int)p_Var6[1]._M_color)) {
    __position._M_node = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)__position._M_node != p_Var1) {
    p_Var3 = __position._M_node[1]._M_parent;
    p_Var4 = __position._M_node[1]._M_left;
    p_Var5 = __position._M_node[1]._M_right;
    __position._M_node[1]._M_parent = (_Base_ptr)0x0;
    __position._M_node[1]._M_left = (_Base_ptr)0x0;
    __position._M_node[1]._M_right = (_Base_ptr)0x0;
    std::
    _Rb_tree<int,std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>,std::_Select1st<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
    ::erase_abi_cxx11_((_Rb_tree<int,std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>,std::_Select1st<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>,std::less<int>,std::allocator<std::pair<int_const,std::vector<FIX::FieldMap*,std::allocator<FIX::FieldMap*>>>>>
                        *)&this->m_groups,__position);
    for (p_Var7 = p_Var3; p_Var7 != p_Var4; p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
      if (*(long **)p_Var7 != (long *)0x0) {
        (**(code **)(**(long **)p_Var7 + 8))();
      }
    }
    removeField(this,tag);
    if (p_Var3 != (_Base_ptr)0x0) {
      operator_delete(p_Var3,(long)p_Var5 - (long)p_Var3);
      return;
    }
  }
  return;
}

Assistant:

void FieldMap::removeGroup(int tag) {
  Groups::iterator tagWithGroups = m_groups.find(tag);
  if (tagWithGroups == m_groups.end()) {
    return;
  }

  std::vector<FieldMap *> toDelete;
  toDelete.swap(tagWithGroups->second);

  m_groups.erase(tagWithGroups);

  std::for_each(toDelete.begin(), toDelete.end(), [](FieldMap *group) { delete group; });

  removeField(tag);
}